

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_DecodeToDic(CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Byte *buf;
  long *in_RCX;
  CLzmaDec *in_RDX;
  SizeT in_RSI;
  CLzmaDec *in_RDI;
  int in_R8D;
  CLzmaDec *in_R9;
  bool bVar4;
  uint kkk;
  int dummyRes_1;
  uint lookAhead;
  uint rem;
  int dummyRes;
  Byte *bufLimit;
  SizeT processed;
  int checkEndMarkNow;
  SizeT inSize;
  ELzmaDummy in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  ELzmaDummy in_stack_ffffffffffffffa4;
  CLzmaDec *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  CLzmaDec *local_20;
  
  buf = (Byte *)*in_RCX;
  *in_RCX = 0;
  LzmaDec_WriteRem(in_RDI,in_RSI);
  (in_R9->prop).lc = 0;
  local_20 = in_RDX;
  do {
    if (in_RDI->remainLen == 0x112) {
      if (in_RDI->code == 0) {
        (in_R9->prop).lc = 1;
      }
      return (uint)(in_RDI->code != 0);
    }
    if (in_RDI->needFlush != 0) {
      while( true ) {
        bVar4 = false;
        if (buf != (Byte *)0x0) {
          bVar4 = in_RDI->tempBufSize < 5;
        }
        if (!bVar4) break;
        uVar1 = (local_20->prop).lc;
        uVar2 = in_RDI->tempBufSize;
        in_RDI->tempBufSize = uVar2 + 1;
        in_RDI->tempBuf[uVar2] = (Byte)uVar1;
        *in_RCX = *in_RCX + 1;
        buf = buf + -1;
        local_20 = (CLzmaDec *)((long)&(local_20->prop).lc + 1);
      }
      if (in_RDI->tempBufSize < 5) {
        (in_R9->prop).lc = 3;
        return 0;
      }
      if (in_RDI->tempBuf[0] != '\0') {
        return 1;
      }
      in_RDI->code = (uint)in_RDI->tempBuf[1] << 0x18 | (uint)in_RDI->tempBuf[2] << 0x10 |
                     (uint)in_RDI->tempBuf[3] << 8 | (uint)in_RDI->tempBuf[4];
      in_RDI->range = 0xffffffff;
      in_RDI->needFlush = 0;
      in_RDI->tempBufSize = 0;
    }
    iVar5 = 0;
    if (in_RSI <= in_RDI->dicPos) {
      if ((in_RDI->remainLen == 0) && (in_RDI->code == 0)) {
        (in_R9->prop).lc = 4;
        return 0;
      }
      if (in_R8D == 0) {
        (in_R9->prop).lc = 2;
        return 0;
      }
      if (in_RDI->remainLen != 0) {
        (in_R9->prop).lc = 2;
        return 1;
      }
      iVar5 = 1;
    }
    if (in_RDI->needInitState != 0) {
      LzmaDec_InitStateReal(in_RDI);
    }
    if (in_RDI->tempBufSize == 0) {
      if ((buf < (Byte *)0x14) || (iVar5 != 0)) {
        in_stack_ffffffffffffffa4 =
             LzmaDec_TryDummy(in_R9,buf,CONCAT44(iVar5,in_stack_ffffffffffffffb8));
        if (in_stack_ffffffffffffffa4 == DUMMY_ERROR) {
          memcpy(in_RDI->tempBuf,local_20,(size_t)buf);
          in_RDI->tempBufSize = (uint)buf;
          *in_RCX = (long)(buf + *in_RCX);
          (in_R9->prop).lc = 3;
          return 0;
        }
        in_stack_ffffffffffffffa8 = local_20;
        if ((iVar5 != 0) && (in_stack_ffffffffffffffa4 != DUMMY_MATCH)) {
          (in_R9->prop).lc = 2;
          return 1;
        }
      }
      else {
        in_stack_ffffffffffffffa8 = (CLzmaDec *)(buf + (long)(local_20->reps + -0x18));
      }
      in_RDI->buf = (Byte *)local_20;
      iVar5 = LzmaDec_DecodeReal2(in_stack_ffffffffffffffa8,
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  (Byte *)CONCAT44(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98));
      if (iVar5 != 0) {
        return 1;
      }
      uVar3 = (long)in_RDI->buf - (long)local_20;
      *in_RCX = uVar3 + *in_RCX;
      buf = buf + -uVar3;
    }
    else {
      in_stack_ffffffffffffff9c = 0;
      for (in_stack_ffffffffffffffa0 = in_RDI->tempBufSize;
          in_stack_ffffffffffffffa0 < 0x14 && (Byte *)(ulong)in_stack_ffffffffffffff9c < buf;
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
        in_RDI->tempBuf[in_stack_ffffffffffffffa0] =
             *(Byte *)((long)local_20->reps + ((ulong)in_stack_ffffffffffffff9c - 0x4c));
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1;
      }
      in_RDI->tempBufSize = in_stack_ffffffffffffffa0;
      if ((in_stack_ffffffffffffffa0 < 0x14) || (iVar5 != 0)) {
        in_stack_ffffffffffffff98 =
             LzmaDec_TryDummy(in_R9,buf,CONCAT44(iVar5,in_stack_ffffffffffffffb8));
        if (in_stack_ffffffffffffff98 == DUMMY_ERROR) {
          *in_RCX = (ulong)in_stack_ffffffffffffff9c + *in_RCX;
          (in_R9->prop).lc = 3;
          return 0;
        }
        if ((iVar5 != 0) && (in_stack_ffffffffffffff98 != DUMMY_MATCH)) {
          (in_R9->prop).lc = 2;
          return 1;
        }
      }
      in_RDI->buf = in_RDI->tempBuf;
      iVar5 = LzmaDec_DecodeReal2(in_stack_ffffffffffffffa8,
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  (Byte *)CONCAT44(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98));
      if (iVar5 != 0) {
        return 1;
      }
      uVar2 = (int)in_RDI->buf - ((int)in_RDI + 0x70);
      if (in_stack_ffffffffffffffa0 < uVar2) {
        return 0xb;
      }
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 - uVar2;
      if (in_stack_ffffffffffffff9c < in_stack_ffffffffffffffa0) {
        return 0xb;
      }
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c - in_stack_ffffffffffffffa0;
      *in_RCX = (ulong)in_stack_ffffffffffffff9c + *in_RCX;
      uVar3 = (ulong)in_stack_ffffffffffffff9c;
      buf = buf + -(ulong)in_stack_ffffffffffffff9c;
      in_RDI->tempBufSize = 0;
    }
    local_20 = (CLzmaDec *)((long)local_20->reps + (uVar3 - 0x4c));
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec *p, SizeT dicLimit, const Byte *src, SizeT *srcLen,
    ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);
  
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart)
  {
      int checkEndMarkNow;

      if (p->needFlush)
      {
        for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
          p->tempBuf[p->tempBufSize++] = *src++;
        if (p->tempBufSize < RC_INIT_SIZE)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (p->tempBuf[0] != 0)
          return SZ_ERROR_DATA;
        p->code =
              ((UInt32)p->tempBuf[1] << 24)
            | ((UInt32)p->tempBuf[2] << 16)
            | ((UInt32)p->tempBuf[3] << 8)
            | ((UInt32)p->tempBuf[4]);
        p->range = 0xFFFFFFFF;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }

      checkEndMarkNow = 0;
      if (p->dicPos >= dicLimit)
      {
        if (p->remainLen == 0 && p->code == 0)
        {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return SZ_OK;
        }
        if (finishMode == LZMA_FINISH_ANY)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_OK;
        }
        if (p->remainLen != 0)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        checkEndMarkNow = 1;
      }

      if (p->needInitState)
        LzmaDec_InitStateReal(p);
  
      if (p->tempBufSize == 0)
      {
        SizeT processed;
        const Byte *bufLimit;
        if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, src, inSize);
          if (dummyRes == DUMMY_ERROR)
          {
            memcpy(p->tempBuf, src, inSize);
            p->tempBufSize = (unsigned)inSize;
            (*srcLen) += inSize;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
          bufLimit = src;
        }
        else
          bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
        p->buf = src;
        if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
          return SZ_ERROR_DATA;
        processed = (SizeT)(p->buf - src);
        (*srcLen) += processed;
        src += processed;
        inSize -= processed;
      }
      else
      {
        unsigned rem = p->tempBufSize, lookAhead = 0;
        while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
          p->tempBuf[rem++] = src[lookAhead++];
        p->tempBufSize = rem;
        if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
          if (dummyRes == DUMMY_ERROR)
          {
            (*srcLen) += lookAhead;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
        }
        p->buf = p->tempBuf;
        if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
          return SZ_ERROR_DATA;
        
        {
          unsigned kkk = (unsigned)(p->buf - p->tempBuf);
          if (rem < kkk)
            return SZ_ERROR_FAIL; /* some internal error */
          rem -= kkk;
          if (lookAhead < rem)
            return SZ_ERROR_FAIL; /* some internal error */
          lookAhead -= rem;
        }
        (*srcLen) += lookAhead;
        src += lookAhead;
        inSize -= lookAhead;
        p->tempBufSize = 0;
      }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}